

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::CustomLayerParams::ByteSizeLong(CustomLayerParams *this)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  Rep *pRVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_58;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_40;
  
  lVar9 = (long)(this->weights_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar9 * 2;
  pRVar6 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 != (Rep *)0x0) {
    pRVar6 = (Rep *)pRVar6->elements;
  }
  if (lVar9 != 0) {
    lVar7 = 0;
    do {
      sVar4 = WeightParams::ByteSizeLong(*(WeightParams **)((long)pRVar6->elements + lVar7 + -8));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar8 = lVar8 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar9 * 8 != lVar7);
  }
  local_40.m_ = (InnerMap *)&this->parameters_;
  sVar4 = lVar8 + ((this->parameters_).map_.elements_.num_elements_ & 0xffffffff) * 2;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  ::SearchFrom(&local_40,(this->parameters_).map_.elements_.index_of_first_non_null_);
  local_58.m_ = local_40.m_;
  local_58.node_ = local_40.node_;
  while (local_58.node_ != (Node *)0x0) {
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58.node_,
                           (CustomLayerParams_CustomLayerParamValue *)&(local_58.node_)->field_0x20)
    ;
    sVar4 = sVar4 + sVar5;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
    ::operator++(&local_58);
  }
  lVar8 = *(long *)(((ulong)(this->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar8 != 0) {
    uVar3 = (uint)lVar8 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + lVar8 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  lVar8 = *(long *)(((ulong)(this->description_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar8 != 0) {
    uVar3 = (uint)lVar8 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + lVar8 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

size_t CustomLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.WeightParams weights = 20;
  total_size += 2UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_parameters_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_iterator
      it = this->_internal_parameters().begin();
      it != this->_internal_parameters().end(); ++it) {
    total_size += CustomLayerParams_ParametersEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string className = 10;
  if (!this->_internal_classname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_classname());
  }

  // string description = 40;
  if (!this->_internal_description().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_description());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}